

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O1

void __thiscall QtMWidgets::Picker::_q_emitCurrentIndexChanged(Picker *this,QModelIndex *index)

{
  QString text;
  QAccessibleEvent event;
  QString local_50;
  code *local_38;
  undefined4 local_30;
  Picker *local_28;
  undefined4 local_20;
  
  currentIndexChanged(this,index->r);
  PickerPrivate::itemText(&local_50,(this->d).d,index);
  currentIndexChanged(this,&local_50);
  currentTextChanged(this,&local_50);
  local_38 = operator_new;
  local_30 = 0x800c;
  local_20 = 0xffffffff;
  local_28 = this;
  QAccessible::updateAccessibility((QAccessibleEvent *)&local_38);
  QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)&local_38);
  if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,8);
    }
  }
  return;
}

Assistant:

void
Picker::_q_emitCurrentIndexChanged( const QModelIndex & index )
{
	emit currentIndexChanged( index.row() );

	const QString text = d->itemText( index );

	emit currentIndexChanged( text );

	emit currentTextChanged( text );

#ifndef QT_NO_ACCESSIBILITY
	QAccessibleEvent event( this, QAccessible::NameChanged );
	QAccessible::updateAccessibility( &event );
#endif
}